

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<std::complex<double>_>::Decompose_LU(TPZMatrix<std::complex<double>_> *this)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  TPZMatrix<std::complex<double>_> *pTVar4;
  long lVar5;
  int64_t j;
  long lVar6;
  long lVar7;
  undefined8 extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double in_XMM1_Qa;
  complex<double> a;
  undefined1 local_a8 [8];
  double dStack_a0;
  double local_98;
  double dStack_90;
  undefined1 local_88 [8];
  double dStack_80;
  long local_70;
  complex<double> local_68;
  double local_58;
  double local_48;
  
  bVar1 = (this->super_TPZBaseMatrix).fDecomposed;
  if (1 < bVar1) {
    Error("Decompose_LU <Matrix already Decomposed with other scheme>",(char *)0x0);
    bVar1 = (this->super_TPZBaseMatrix).fDecomposed;
  }
  if (bVar1 == 0) {
    local_a8 = (undefined1  [8])0x0;
    dStack_a0 = 0.0;
    local_88 = (undefined1  [8])0x0;
    dStack_80 = 0.0;
    local_70 = (this->super_TPZBaseMatrix).fRow;
    lVar3 = (this->super_TPZBaseMatrix).fCol;
    if (lVar3 < local_70) {
      local_70 = lVar3;
    }
    if (local_70 < 1) {
      local_70 = 0;
    }
    lVar3 = 0;
    while (lVar5 = lVar3, lVar5 != local_70) {
      lVar3 = lVar5;
      pTVar4 = this;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar5,lVar5);
      a._M_value._8_8_ = lVar3;
      a._M_value._0_8_ = pTVar4;
      local_88 = (undefined1  [8])extraout_XMM0_Qa;
      dStack_80 = in_XMM1_Qa;
      bVar2 = IsZero(a);
      if (bVar2) {
        Error("Decompose_LU <matrix is singular>",(char *)0x0);
      }
      lVar3 = lVar5 + 1;
      for (lVar7 = lVar3; lVar7 < (this->super_TPZBaseMatrix).fRow; lVar7 = lVar7 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar7,lVar5);
        local_98 = extraout_XMM0_Qa_00;
        dStack_90 = in_XMM1_Qa;
        std::operator/((complex<double> *)&local_98,(complex<double> *)local_88);
        local_a8 = (undefined1  [8])extraout_XMM0_Qa_01;
        dStack_a0 = in_XMM1_Qa;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar7,lVar5,local_a8);
        for (lVar6 = lVar3; lVar6 < (this->super_TPZBaseMatrix).fCol; lVar6 = lVar6 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar7,lVar6);
          local_58 = in_XMM1_Qa;
          local_48 = extraout_XMM0_Qa_02;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar5,lVar6);
          std::operator*((complex<double> *)local_a8,&local_68);
          local_98 = local_48 - extraout_XMM0_Qa_03;
          dStack_90 = local_58 - in_XMM1_Qa;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar7,lVar6,(complex<double> *)&local_98);
        }
      }
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x01';
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LU() {
	
	if (  fDecomposed && fDecomposed != ELU)  Error( "Decompose_LU <Matrix already Decomposed with other scheme>" );
	if (fDecomposed) return 1;
	
	TVar nn, pivot;
	int64_t  min = ( Cols() < (Rows()) ) ? Cols() : Rows();
	
	for ( int64_t k = 0; k < min ; k++ ) {
		if (IsZero( pivot = GetVal(k, k))) Error( "Decompose_LU <matrix is singular>" );
		for ( int64_t i = k+1; i < Rows(); i++ ) {
			nn = GetVal( i, k ) / pivot;
			PutVal( i, k, nn );
			for ( int64_t j = k+1; j < Cols(); j++ ) PutVal(i,j,GetVal(i,j)-nn*GetVal(k,j));
		}
	}
	fDecomposed=ELU;
	return 1;
}